

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Coherence.hpp
# Opt level: O0

ClauseGenerationResult __thiscall
Inferences::ALASCA::CoherenceNormalization<Kernel::NumTraits<Kernel::RealConstantType>_>::
generateSimplify(CoherenceNormalization<Kernel::NumTraits<Kernel::RationalConstantType>_> *this,
                Clause *premise)

{
  undefined8 extraout_RDX;
  IteratorCore<Kernel::Clause_*> *in_RDI;
  ClauseGenerationResult CVar1;
  ClauseIterator CVar2;
  undefined1 local_470 [376];
  IterTraits<Lib::FilterMapIter<Lib::FilteredIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Superposition_hpp:57:22),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Superposition_hpp:58:22),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Superposition_hpp:59:19),_Inferences::ALASCA::SuperpositionConf::Lhs>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Coherence_hpp:246:33),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Coherence_hpp:247:36)>_>
  *in_stack_fffffffffffffd08;
  Clause *in_stack_fffffffffffffe60;
  AlascaState *in_stack_fffffffffffffe68;
  IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Superposition_hpp:57:22),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Superposition_hpp:58:22),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Superposition_hpp:59:19),_Inferences::ALASCA::SuperpositionConf::Lhs>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Coherence_hpp:246:33),_false>_>
  *in_stack_fffffffffffffe90;
  anon_class_8_1_8991fb9c_for__func in_stack_fffffffffffffe98;
  
  CVar2._core = in_RDI;
  std::__shared_ptr_access<Kernel::AlascaState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<Kernel::AlascaState,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_RDI);
  SuperpositionConf::Lhs::iter(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,Kernel::OrderingUtils::maxElems<Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int,unsigned_int)#1},Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int)#1}>(unsigned_int,Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int,unsigned_int)#1},Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int)#1},Kernel::OrderingUtils::SelectionCriterion,bool)::{lambda(auto:1)#1}>,Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(auto:1)#1},Kernel::SelectedLiteral>,Kernel::AlascaState::selectedActivePositions(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion,Kernel::OrderingUtils::SelectionCriterion,bool)::{lambda(auto:1)#1},Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,Kernel::SelectedUninterpretedEquality,Kernel::SelectedUninterpretedPredicate>>>>,Kernel::AlascaState::selectedEqualities(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion,Kernel::OrderingUtils::SelectionCriterion,bool)::{lambda(auto:1)#1}>,Inferences::ALASCA::SuperpositionConf::Lhs::iter(Kernel::AlascaState&,Kernel::Clause*)::{lambda(auto:1)#1},false>,Inferences::ALASCA::SuperpositionConf::Lhs::iter(Kernel::AlascaState&,Kernel::Clause*)::{lambda(auto:1&)#1},false>,Inferences::ALASCA::SuperpositionConf::Lhs::iter(Kernel::AlascaState&,Kernel::Clause*)::{lambda(auto:1)#2},Inferences::ALASCA::SuperpositionConf::Lhs>>
  ::
  filter<Inferences::ALASCA::CoherenceNormalization<Kernel::NumTraits<Kernel::RealConstantType>>::generateSimplify(Kernel::Clause*)::_lambda(auto:1&)_1_>
            ((IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Superposition_hpp:57:22),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Superposition_hpp:58:22),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Superposition_hpp:59:19),_Inferences::ALASCA::SuperpositionConf::Lhs>_>
              *)(local_470 + 0x140),local_470);
  Lib::
  IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,Kernel::OrderingUtils::maxElems<Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int,unsigned_int)#1},Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int)#1}>(unsigned_int,Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int,unsigned_int)#1},Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int)#1},Kernel::OrderingUtils::SelectionCriterion,bool)::{lambda(auto:1)#1}>,Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(auto:1)#1},Kernel::SelectedLiteral>,Kernel::AlascaState::selectedActivePositions(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion,Kernel::OrderingUtils::SelectionCriterion,bool)::{lambda(auto:1)#1},Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,Kernel::SelectedUninterpretedEquality,Kernel::SelectedUninterpretedPredicate>>>>,Kernel::AlascaState::selectedEqualities(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion,Kernel::OrderingUtils::SelectionCriterion,bool)::{lambda(auto:1)#1}>,Inferences::ALASCA::SuperpositionConf::Lhs::iter(Kernel::AlascaState&,Kernel::Clause*)::{lambda(auto:1)#1},false>,Inferences::ALASCA::SuperpositionConf::Lhs::iter(Kernel::AlascaState&,Kernel::Clause*)::{lambda(auto:1&)#1},false>,Inferences::ALASCA::SuperpositionConf::Lhs::iter(Kernel::AlascaState&,Kernel::Clause*)::{lambda(auto:1)#2},Inferences::ALASCA::SuperpositionConf::Lhs>,Inferences::ALASCA::CoherenceNormalization<Kernel::NumTraits<Kernel::RealConstantType>>::generateSimplify(Kernel::Clause*)::{lambda(auto:1&)#1},false>>
  ::
  filterMap<Inferences::ALASCA::CoherenceNormalization<Kernel::NumTraits<Kernel::RealConstantType>>::generateSimplify(Kernel::Clause*)::_lambda(auto:1)_1_>
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe98);
  Lib::
  pvi<Lib::IterTraits<Lib::FilterMapIter<Lib::FilteredIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,Kernel::OrderingUtils::maxElems<Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::_lambda(unsigned_int,unsigned_int)_1_,Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::_lambda(unsigned_int)_1_>(unsigned_int,Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::_lambda(unsigned_int,unsigned_int)_1_,Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::_lambda(unsigned_int)_1_,Kernel::OrderingUtils::SelectionCriterion,bool)::_lambda(auto:1)_1_>,Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::_lambda(auto:1)_1_,Kernel::SelectedLiteral>,Kernel:___rnel::NumTraits<Kernel::RealConstantType>>::generateSimplify(Kernel::Clause*)::_lambda(auto:1)_1_>>>
            (in_stack_fffffffffffffd08);
  *(undefined1 *)&in_RDI->_refCnt = 0;
  Lib::
  IterTraits<Lib::FilterMapIter<Lib::FilteredIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/Superposition.hpp:57:22),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/Superposition.hpp:58:22),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/Superposition.hpp:59:19),_Inferences::ALASCA::SuperpositionConf::Lhs>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/Coherence.hpp:246:33),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/Coherence.hpp:247:36)>_>
  ::~IterTraits((IterTraits<Lib::FilterMapIter<Lib::FilteredIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Superposition_hpp:57:22),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Superposition_hpp:58:22),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Superposition_hpp:59:19),_Inferences::ALASCA::SuperpositionConf::Lhs>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Coherence_hpp:246:33),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Coherence_hpp:247:36)>_>
                 *)0xb5ec46);
  Lib::
  IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/Superposition.hpp:57:22),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/Superposition.hpp:58:22),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/Superposition.hpp:59:19),_Inferences::ALASCA::SuperpositionConf::Lhs>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/Coherence.hpp:246:33),_false>_>
  ::~IterTraits((IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Superposition_hpp:57:22),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Superposition_hpp:58:22),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Superposition_hpp:59:19),_Inferences::ALASCA::SuperpositionConf::Lhs>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Coherence_hpp:246:33),_false>_>
                 *)0xb5ec53);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/Superposition.hpp:57:22),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/Superposition.hpp:58:22),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/Superposition.hpp:59:19),_Inferences::ALASCA::SuperpositionConf::Lhs>_>
  ::~IterTraits((IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Superposition_hpp:57:22),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Superposition_hpp:58:22),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Superposition_hpp:59:19),_Inferences::ALASCA::SuperpositionConf::Lhs>_>
                 *)0xb5ec5d);
  CVar1._8_8_ = extraout_RDX;
  CVar1.clauses._core = CVar2._core;
  return CVar1;
}

Assistant:

ClauseGenerationResult generateSimplify(Clause* premise) final override {
    return ClauseGenerationResult {
      .clauses = pvi( Superposition::Lhs::iter(*shared, premise)
                        .filter([](auto& x) { return NumTraits::isFloor(x.biggerSide()); })
                        .filterMap([this](auto x) { return apply(std::move(x)); })),
      .premiseRedundant = false,
    };
  }